

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgzip.c
# Opt level: O2

void ft_gzip_file_done(FT_GZipFile zip)

{
  inflateEnd(&zip->zstream);
  (zip->zstream).next_out = (Bytef *)0x0;
  (zip->zstream).avail_out = 0;
  zip->source = (FT_Stream)0x0;
  zip->stream = (FT_Stream)0x0;
  zip->memory = (FT_Memory)0x0;
  (zip->zstream).next_in = (Bytef *)0x0;
  (zip->zstream).avail_in = 0;
  (zip->zstream).zalloc = (alloc_func)0x0;
  (zip->zstream).zfree = (free_func)0x0;
  (zip->zstream).opaque = (voidpf)0x0;
  return;
}

Assistant:

static void
  ft_gzip_file_done( FT_GZipFile  zip )
  {
    z_stream*  zstream = &zip->zstream;


    inflateEnd( zstream );

    /* clear the rest */
    zstream->zalloc    = NULL;
    zstream->zfree     = NULL;
    zstream->opaque    = NULL;
    zstream->next_in   = NULL;
    zstream->next_out  = NULL;
    zstream->avail_in  = 0;
    zstream->avail_out = 0;

    zip->memory = NULL;
    zip->source = NULL;
    zip->stream = NULL;
  }